

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

void __thiscall testing::internal::DeathTestImpl::~DeathTestImpl(DeathTestImpl *this)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 extraout_RAX;
  long *plVar4;
  ulong *puVar5;
  size_type *psVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  int local_ac;
  string local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string local_48;
  undefined1 *local_28 [2];
  undefined1 local_18 [16];
  
  (this->super_DeathTest)._vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_0014b8d8;
  if (this->read_fd_ == -1) {
    return;
  }
  local_28[0] = local_18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_28,"CHECK failed: File ","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_28);
  local_88 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_88 == plVar4) {
    local_78 = *plVar4;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar4;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_88);
  local_d0 = (ulong *)*plVar2;
  puVar5 = (ulong *)(plVar2 + 2);
  if (local_d0 == puVar5) {
    local_c0 = *puVar5;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar5;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_ac = 0x1ad4;
  StreamableToString<int>(&local_a8,&local_ac);
  uVar7 = 0xf;
  if (local_d0 != &local_c0) {
    uVar7 = local_c0;
  }
  if (uVar7 < local_a8._M_string_length + local_c8) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      uVar8 = local_a8.field_2._M_allocated_capacity;
    }
    if (local_a8._M_string_length + local_c8 <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_d0);
      goto LAB_0013620c;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_a8._M_dataplus._M_p);
LAB_0013620c:
  local_f0 = (undefined8 *)*puVar3;
  puVar1 = puVar3 + 2;
  if (local_f0 == puVar1) {
    local_e0 = *puVar1;
    uStack_d8 = puVar3[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar1;
  }
  local_e8 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_68 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_68 == plVar4) {
    local_58 = *plVar4;
    lStack_50 = plVar2[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar4;
  }
  local_60 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_48._M_dataplus._M_p = (pointer)*plVar2;
  psVar6 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_48._M_dataplus._M_p == psVar6) {
    local_48.field_2._M_allocated_capacity = *psVar6;
    local_48.field_2._8_8_ = plVar2[3];
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = *psVar6;
  }
  local_48._M_string_length = plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  DeathTestAbort(&local_48);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

~DeathTestImpl() { GTEST_DEATH_TEST_CHECK_(read_fd_ == -1); }